

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O0

size_t __thiscall
s2coding::EncodedUintVector<unsigned_int>::lower_bound
          (EncodedUintVector<unsigned_int> *this,uint target)

{
  bool bVar1;
  ostream *poVar2;
  S2LogMessage local_30;
  S2LogMessageVoidify local_1d;
  uint local_1c;
  EncodedUintVector<unsigned_int> *pEStack_18;
  uint target_local;
  EncodedUintVector<unsigned_int> *this_local;
  
  bVar1 = false;
  if (this->len_ != '\0') {
    bVar1 = this->len_ < 5;
  }
  local_1c = target;
  pEStack_18 = this;
  if (!bVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
               ,0xfd,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_30);
    poVar2 = std::operator<<(poVar2,"Check failed: len_ >= 1 && len_ <= sizeof(T) ");
    S2LogMessageVoidify::operator&(&local_1d,poVar2);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  switch(this->len_) {
  case '\x01':
    this_local = (EncodedUintVector<unsigned_int> *)lower_bound<1>(this,target);
    break;
  case '\x02':
    this_local = (EncodedUintVector<unsigned_int> *)lower_bound<2>(this,target);
    break;
  case '\x03':
    this_local = (EncodedUintVector<unsigned_int> *)lower_bound<3>(this,target);
    break;
  case '\x04':
    this_local = (EncodedUintVector<unsigned_int> *)lower_bound<4>(this,target);
    break;
  case '\x05':
    this_local = (EncodedUintVector<unsigned_int> *)lower_bound<5>(this,target);
    break;
  case '\x06':
    this_local = (EncodedUintVector<unsigned_int> *)lower_bound<6>(this,target);
    break;
  case '\a':
    this_local = (EncodedUintVector<unsigned_int> *)lower_bound<7>(this,target);
    break;
  default:
    this_local = (EncodedUintVector<unsigned_int> *)lower_bound<8>(this,target);
  }
  return (size_t)this_local;
}

Assistant:

size_t EncodedUintVector<T>::lower_bound(T target) const {
  static_assert(sizeof(T) & 0xe, "Unsupported integer length");
  S2_DCHECK(len_ >= 1 && len_ <= sizeof(T));

  // TODO(ericv): Consider using the unused 28 bits of "len_" to store the
  // last result of lower_bound() to be used as a hint.  This should help in
  // common situation where the same element is looked up repeatedly.  This
  // would require declaring the new field (length_lower_bound_hint_) as
  // mutable std::atomic<uint32> (accessed using std::memory_order_relaxed)
  // with a custom copy constructor that resets the hint component to zero.
  switch (len_) {
    case 1: return lower_bound<1>(target);
    case 2: return lower_bound<2>(target);
    case 3: return lower_bound<3>(target);
    case 4: return lower_bound<4>(target);
    case 5: return lower_bound<5>(target);
    case 6: return lower_bound<6>(target);
    case 7: return lower_bound<7>(target);
    default: return lower_bound<8>(target);
  }
}